

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O3

HelicsFilter anon_unknown.dwarf_ba607::findOrCreateFederateFilter(HelicsFederate fed,Filter *filter)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  FilterObject *pFVar5;
  HelicsFilter pvVar6;
  long *plVar7;
  pointer *__ptr;
  ulong uVar8;
  _Head_base<0UL,_helics::FilterObject_*,_false> local_38;
  FilterObject *local_30;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  iVar1 = (filter->super_Interface).handle.hid;
  plVar7 = *(long **)((long)fed + 0x98);
  uVar8 = (long)*(long **)((long)fed + 0xa0) - (long)plVar7 >> 3;
  while (uVar2 = uVar8, 0 < (long)uVar2) {
    uVar8 = uVar2 >> 1;
    if (*(int *)(*(long *)(plVar7[uVar8] + 8) + 0x10) <= iVar1) {
      plVar7 = plVar7 + uVar8 + 1;
      uVar8 = ~uVar8 + uVar2;
    }
  }
  if ((plVar7 == *(long **)((long)fed + 0xa0)) ||
     (pvVar6 = (HelicsFilter)*plVar7, *(int *)(*(long *)((long)pvVar6 + 8) + 0x10) != iVar1)) {
    pFVar5 = (FilterObject *)operator_new(0x58);
    (pFVar5->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pFVar5->buffer)._M_dataplus._M_p = (pointer)0x0;
    pFVar5->cloning = false;
    pFVar5->custom = false;
    *(undefined2 *)&pFVar5->field_0x2 = 0;
    pFVar5->valid = 0;
    pFVar5->filtPtr = (Filter *)0x0;
    (pFVar5->uFilter)._M_t.
    super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
    super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
    super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
    (pFVar5->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pFVar5->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pFVar5->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pFVar5->buffer)._M_string_length = 0;
    (pFVar5->buffer).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pFVar5->buffer).field_2 + 8) = 0;
    (pFVar5->buffer)._M_dataplus._M_p = (pointer)&(pFVar5->buffer).field_2;
    pFVar5->filtPtr = filter;
    pFVar5->cloning = filter->cloning;
    local_30 = pFVar5;
    getFedSharedPtr(&local_28,(HelicsError *)fed);
    p_Var4 = p_Stack_20;
    peVar3 = local_28;
    local_28 = (element_type *)0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (pFVar5->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (pFVar5->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar3;
    (pFVar5->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var4;
    if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
       p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
    }
    local_38._M_head_impl = local_30;
    local_30 = (FilterObject *)0x0;
    pvVar6 = federateAddFilter(fed,(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                                    *)&local_38);
    if (local_38._M_head_impl != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_38,local_38._M_head_impl);
    }
    local_38._M_head_impl = (FilterObject *)0x0;
    if (local_30 != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_30,local_30);
    }
  }
  return pvVar6;
}

Assistant:

HelicsFilter findOrCreateFederateFilter(HelicsFederate fed, helics::Filter& filter)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    const auto handle = filter.getHandle();
    auto ind = std::upper_bound(fedObj->filters.begin(), fedObj->filters.end(), handle, filterSearch);
    if (ind != fedObj->filters.end() && (*ind)->filtPtr->getHandle() == handle) {
        HelicsFilter hfilt = ind->get();
        return hfilt;
    }

    auto filt = std::make_unique<helics::FilterObject>();
    filt->filtPtr = &filter;
    filt->cloning = filter.isCloningFilter();
    filt->fedptr = getFedSharedPtr(fed, nullptr);
    return federateAddFilter(fed, std::move(filt));
}